

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_client.cc
# Opt level: O1

ssl_hs_wait_t bssl::tls13_client_handshake(SSL_HANDSHAKE *hs)

{
  uint8_t *puVar1;
  ushort uVar2;
  anon_union_4_2_c8db58f8_for_extensions aVar3;
  ECHConfig *pEVar4;
  _Head_base<0UL,_buf_mem_st_*,_false> __p;
  SSL_SESSION *pSVar5;
  SSL3_STATE *pSVar6;
  size_t sVar7;
  ssl_session_st *psVar8;
  CERT *pCVar9;
  _func_int_SSL_ptr_void_ptr *p_Var10;
  SSL_CREDENTIAL *cred;
  ssl_session_st *psVar11;
  size_t __n;
  Prover *pPVar12;
  SSLKeyShare *pSVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  Span<const_unsigned_char> traffic_secret;
  Span<const_unsigned_char> traffic_secret_00;
  Span<const_unsigned_char> traffic_secret_01;
  Span<const_unsigned_char> traffic_secret_02;
  Span<const_unsigned_char> in;
  undefined1 auVar17 [8];
  ssl_credential_st *psVar18;
  UniquePtr<struct_stack_st_CRYPTO_BUFFER> *pUVar19;
  bool bVar20;
  bool bVar21;
  uint16_t uVar22;
  uint16_t uVar23;
  ssl_private_key_result_t sVar24;
  SSLSessionType SVar25;
  ssl_verify_result_t sVar26;
  int iVar27;
  SSL_CIPHER *cipher;
  uchar *puVar28;
  ulong uVar29;
  EVP_MD *md;
  undefined4 extraout_var;
  OPENSSL_STACK *__p_00;
  uint *puVar30;
  CBS *contents;
  uint uVar31;
  byte bVar32;
  ptrdiff_t _Num_1;
  undefined1 *puVar33;
  SSL *pSVar34;
  int iVar35;
  ulong in_R9;
  ptrdiff_t _Num;
  Array<unsigned_char> *pAVar36;
  ssl_hs_wait_t sVar37;
  ssl_hs_wait_t sVar38;
  SSL_HANDSHAKE *pSVar39;
  undefined4 unaff_R14D;
  uint8_t *puVar40;
  initializer_list<bssl::SSLExtension_*> extensions;
  Span<const_unsigned_char> psk;
  Span<const_unsigned_char> in_00;
  Span<const_unsigned_char> in_01;
  bool ech_accepted;
  uint8_t alert;
  CBS cookie_value;
  SSLExtension key_share;
  SSLExtension supported_versions;
  SSLExtension ech_unused;
  ParsedServerHello server_hello;
  SSLExtension cookie;
  SSLMessage msg;
  uint in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  SSL_HANDSHAKE *in_stack_fffffffffffffe10;
  SSL_HANDSHAKE *ssl;
  CBS local_1e8;
  undefined1 local_1d8 [8];
  undefined1 auStack_1d0 [48];
  undefined1 local_1a0 [16];
  long lStack_190;
  undefined1 local_188 [3];
  char cStack_185;
  CBS local_180;
  SSLTranscript *local_170;
  undefined1 local_168 [16];
  long lStack_158;
  SSLTranscript *local_150;
  undefined1 local_148 [80];
  undefined1 local_f8 [3];
  byte bStack_f5;
  undefined4 uStack_f4;
  undefined1 auStack_f0 [40];
  undefined1 local_c8 [8];
  undefined1 auStack_c0 [48];
  UniquePtr<SSL_SESSION> *local_90;
  Array<unsigned_char> *local_88;
  UniquePtr<struct_stack_st_CRYPTO_BUFFER> *local_80;
  UniquePtr<SSL_CREDENTIAL> *local_78;
  ulong local_70;
  SSL_SESSION *local_68;
  SSL_SESSION *local_60;
  uint8_t *local_58;
  EVP_MD_CTX *local_50;
  EVP_MD_CTX *local_48;
  SSL_SESSION *local_40;
  SSL_SESSION *local_38;
  
  local_38 = (SSL_SESSION *)&hs->client_traffic_secret_0;
  local_40 = (SSL_SESSION *)&hs->server_traffic_secret_0;
  local_78 = &hs->credential;
  local_170 = &hs->transcript;
  local_80 = &hs->ca_names;
  local_48 = &(hs->transcript).hash_.ctx_;
  local_50 = &(hs->inner_transcript).hash_.ctx_;
  local_58 = hs->inner_client_random;
  local_90 = &hs->new_session;
  local_60 = (SSL_SESSION *)&hs->client_handshake_secret;
  local_68 = (SSL_SESSION *)&hs->server_handshake_secret;
  local_150 = &hs->inner_transcript;
  local_88 = &hs->cookie;
  do {
    local_70 = (ulong)(uint)hs->tls13_state;
    puVar30 = &switchD_00167348::switchdataD_002380d0;
    sVar37 = ssl_hs_error;
    switch(local_70) {
    case 0:
      pSVar34 = hs->ssl;
      if (pSVar34->s3->version == 0) {
        __assert_fail("ssl->s3->version != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                      ,0xb9,"enum ssl_hs_wait_t bssl::do_read_hello_retry_request(SSL_HANDSHAKE *)")
        ;
      }
      bVar21 = (*pSVar34->method->get_message)(pSVar34,(SSLMessage *)local_c8);
      sVar37 = ssl_hs_read_message;
      if (bVar21) {
        if ((hs->field_0x6c9 & 8) == 0) {
          bVar21 = (*pSVar34->method->add_change_cipher_spec)(pSVar34);
          sVar37 = ssl_hs_error;
          if (!bVar21) break;
        }
        local_148._16_2_ = 0;
        local_148._56_2_ = 0;
        local_148[0x3a] = '\0';
        local_1e8.data = (uint8_t *)CONCAT71(local_1e8.data._1_7_,0x32);
        bVar21 = parse_server_hello_tls13
                           (hs,(ParsedServerHello *)local_148,(uint8_t *)&local_1e8,
                            (SSLMessage *)local_c8);
        in_stack_fffffffffffffe0c = unaff_R14D;
        if (!bVar21) goto LAB_00168153;
        cipher = SSL_get_cipher_by_value(local_148._56_2_);
        in_stack_fffffffffffffe0c = unaff_R14D;
        if (cipher == (SSL_CIPHER *)0x0) {
LAB_0016816a:
          iVar27 = 0xf2;
          iVar35 = 0xd7;
LAB_00168186:
          ERR_put_error(0x10,0,iVar27,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                        ,iVar35);
          iVar27 = 0x2f;
        }
        else {
          uVar23 = SSL_CIPHER_get_min_version(cipher);
          uVar22 = ssl_protocol_version(pSVar34);
          in_stack_fffffffffffffe0c = unaff_R14D;
          in_stack_fffffffffffffe10 = hs;
          if (uVar22 < uVar23) goto LAB_0016816a;
          uVar23 = SSL_CIPHER_get_max_version(cipher);
          uVar22 = ssl_protocol_version(pSVar34);
          in_stack_fffffffffffffe0c = unaff_R14D;
          in_stack_fffffffffffffe10 = hs;
          if (uVar23 < uVar22) goto LAB_0016816a;
          uVar23 = SSL_CIPHER_get_protocol_id(cipher);
          bVar21 = ssl_tls13_cipher_meets_policy
                             (uVar23,((pSVar34->config)._M_t.
                                      super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl
                                     )->compliance_policy);
          in_stack_fffffffffffffe0c = unaff_R14D;
          if (!bVar21) goto LAB_0016816a;
          hs->new_cipher = cipher;
          bVar21 = false;
          if (local_148._32_8_ == 0x20) {
            iVar27 = bcmp((void *)local_148._24_8_,kHelloRetryRequest,0x20);
            bVar21 = iVar27 == 0;
            in_stack_fffffffffffffe0c = unaff_R14D;
          }
          uVar23 = ssl_protocol_version(pSVar34);
          bVar20 = SSLTranscript::InitHash(local_170,uVar23,hs->new_cipher);
          sVar37 = ssl_hs_error;
          unaff_R14D = in_stack_fffffffffffffe0c;
          if ((!bVar20) ||
             ((bVar21 &&
              (bVar20 = SSLTranscript::UpdateForHelloRetryRequest(local_170),
              unaff_R14D = in_stack_fffffffffffffe0c, !bVar20)))) break;
          if ((hs->selected_ech_config)._M_t.
              super___uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bssl::ECHConfig_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bssl::ECHConfig_*,_false>._M_head_impl != (ECHConfig *)0x0) {
            uVar23 = ssl_protocol_version(pSVar34);
            bVar20 = SSLTranscript::InitHash(local_150,uVar23,hs->new_cipher);
            sVar37 = ssl_hs_error;
            unaff_R14D = in_stack_fffffffffffffe0c;
            if ((!bVar20) ||
               ((bVar21 &&
                (bVar20 = SSLTranscript::UpdateForHelloRetryRequest(local_150),
                unaff_R14D = in_stack_fffffffffffffe0c, !bVar20)))) break;
          }
          bVar20 = check_ech_confirmation
                             (hs,(bool *)&stack0xfffffffffffffe0b,(uint8_t *)&local_1e8,
                              (ParsedServerHello *)local_148);
          if (!bVar20) {
LAB_00168153:
            ssl_send_alert(pSVar34,2,(uint)(byte)local_1e8.data);
            sVar37 = ssl_hs_error;
            unaff_R14D = in_stack_fffffffffffffe0c;
            break;
          }
          pEVar4 = (hs->selected_ech_config)._M_t.
                   super___uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bssl::ECHConfig_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bssl::ECHConfig_*,_false>._M_head_impl;
          if (pEVar4 != (ECHConfig *)0x0) {
            pSVar34->s3->ech_status = ssl_ech_rejected - (in_stack_fffffffffffffe08 >> 0x18);
          }
          if (!bVar21) {
            hs->tls13_state = 2;
            sVar37 = ssl_hs_ok;
            unaff_R14D = in_stack_fffffffffffffe0c;
            break;
          }
          _local_f8 = (ssl_credential_st *)CONCAT44(uStack_f4,0x1002c);
          auStack_f0._0_8_ = (SSL_CONFIG *)0x0;
          auStack_f0._8_8_ = (uint8_t *)0x0;
          local_1a0[2] = (hs->key_share_bytes).size_ != 0;
          local_1a0._0_2_ = 0x33;
          local_1a0[3] = '\0';
          local_1a0._8_8_ = 0;
          lStack_190 = 0;
          _local_188 = 0x1002b;
          local_180.data = (uint8_t *)0x0;
          local_180.len = 0;
          local_168[2] = 1;
          if (pEVar4 == (ECHConfig *)0x0) {
            local_168[2] = hs->config->field_0x10d & 1;
          }
          local_168._0_2_ = 0xfe0d;
          local_168[3] = 0;
          local_168._8_8_ = 0;
          lStack_158 = 0;
          local_1d8 = (undefined1  [8])local_f8;
          auStack_1d0._0_8_ = local_1a0;
          auStack_1d0._8_8_ = local_188;
          auStack_1d0._16_8_ = local_168;
          bVar21 = ssl_parse_extensions
                             ((bssl *)(local_148 + 0x40),&local_1e8,local_1d8,
                              (initializer_list<bssl::SSLExtension_*>)ZEXT816(4),SUB81(in_R9,0));
          if (!bVar21) goto LAB_00168153;
          if (bStack_f5 == '\0') {
            if (local_1a0[3] != '\0') {
LAB_00168bfd:
              if (local_1a0[3] == '\x01') {
                if ((hs->pake_prover)._M_t.
                    super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl !=
                    (Prover *)0x0) {
                  __assert_fail("!hs->pake_prover",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                                ,0x122,
                                "enum ssl_hs_wait_t bssl::do_read_hello_retry_request(SSL_HANDSHAKE *)"
                               );
                }
                iVar27 = CBS_get_u16((CBS *)(local_1a0 + 8),(uint16_t *)local_1d8);
                if ((iVar27 == 0) || (lStack_190 != 0)) {
                  ERR_put_error(0x10,0,0x89,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                                ,0x127);
                  ssl_send_alert(pSVar34,2,0x32);
                  hs = in_stack_fffffffffffffe10;
                  goto LAB_00168fb0;
                }
                bVar21 = tls1_check_group_id(in_stack_fffffffffffffe10,local_1d8._0_2_);
                if (bVar21) {
                  iVar27 = (*(in_stack_fffffffffffffe10->key_shares[0]._M_t.
                              super___uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>._M_t
                              .super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>._M_head_impl)->
                             _vptr_SSLKeyShare[2])();
                  if ((uint16_t)iVar27 != local_1d8._0_2_) {
                    pSVar13 = in_stack_fffffffffffffe10->key_shares[1]._M_t.
                              super___uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>._M_t
                              .super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>._M_head_impl;
                    hs = in_stack_fffffffffffffe10;
                    if (pSVar13 != (SSLKeyShare *)0x0) {
                      iVar27 = (*pSVar13->_vptr_SSLKeyShare[2])();
                      hs = in_stack_fffffffffffffe10;
                      if ((uint16_t)iVar27 == local_1d8._0_2_) goto LAB_00168c8f;
                    }
                    in_stack_fffffffffffffe10 = hs;
                    bVar21 = ssl_setup_key_shares(hs,local_1d8._0_2_);
                    sVar37 = ssl_hs_error;
                    unaff_R14D = in_stack_fffffffffffffe0c;
                    if (!bVar21) break;
                    goto LAB_00168ff4;
                  }
LAB_00168c8f:
                  ssl_send_alert(pSVar34,2,0x2f);
                  iVar27 = 0x138;
                }
                else {
                  ssl_send_alert(pSVar34,2,0x2f);
                  iVar27 = 0x12f;
                }
                ERR_put_error(0x10,0,0xf3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                              ,iVar27);
                hs = in_stack_fffffffffffffe10;
LAB_00168fb0:
                sVar37 = ssl_hs_error;
                in_stack_fffffffffffffe10 = hs;
                unaff_R14D = in_stack_fffffffffffffe0c;
              }
              else {
LAB_00168ff4:
                bVar21 = ssl_hash_message(hs,(SSLMessage *)local_c8);
                sVar37 = ssl_hs_error;
                unaff_R14D = in_stack_fffffffffffffe0c;
                if ((bVar21) &&
                   ((pSVar34->s3->ech_status != ssl_ech_accepted ||
                    (in.size_ = auStack_c0._24_8_, in.data_ = (uchar *)auStack_c0._16_8_,
                    bVar21 = SSLTranscript::Update(local_150,in),
                    unaff_R14D = in_stack_fffffffffffffe0c, bVar21)))) {
                  hs = in_stack_fffffffffffffe10;
                  bVar21 = (*pSVar34->method->has_unprocessed_handshake_data)(pSVar34);
                  if (bVar21) {
                    ssl_send_alert(pSVar34,2,10);
                    ERR_put_error(0x10,0,0xff,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                                  ,0x150);
                    goto LAB_00168fb0;
                  }
                  (*pSVar34->method->next_message)(pSVar34);
                  puVar33 = &pSVar34->s3->field_0xdc;
                  *(ushort *)puVar33 = *(ushort *)puVar33 | 0x1000;
                  hs->tls13_state = 1;
                  sVar37 = ssl_hs_ok;
                  in_stack_fffffffffffffe10 = hs;
                  unaff_R14D = in_stack_fffffffffffffe0c;
                  if ((hs->field_0x6c9 & 4) != 0) {
                    pSVar34->s3->early_data_reason = ssl_early_data_hello_retry_request;
                    bVar21 = close_early_data(hs,ssl_encryption_initial);
                    sVar37 = ssl_hs_error;
                    unaff_R14D = in_stack_fffffffffffffe0c;
                    if (bVar21) {
                      sVar37 = ssl_hs_early_data_rejected;
                    }
                  }
                }
              }
              break;
            }
            iVar27 = 0x11a;
            iVar35 = 0x10c;
            goto LAB_00168186;
          }
          iVar27 = CBS_get_u16_length_prefixed((CBS *)auStack_f0,(CBS *)local_1d8);
          uVar14 = auStack_1d0._0_8_;
          auVar17 = local_1d8;
          if (((iVar27 != 0) && ((uchar *)auStack_1d0._0_8_ != (uchar *)0x0)) &&
             ((uint8_t *)auStack_f0._8_8_ == (uint8_t *)0x0)) {
            bVar21 = Array<unsigned_char>::InitUninitialized(local_88,auStack_1d0._0_8_);
            hs = in_stack_fffffffffffffe10;
            if (bVar21) {
              memmove(local_88->data_,(void *)auVar17,uVar14);
              in_stack_fffffffffffffe10 = hs;
              goto LAB_00168bfd;
            }
            goto LAB_00168fb0;
          }
          ERR_put_error(0x10,0,0x89,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                        ,0x115);
          iVar27 = 0x32;
        }
        sVar37 = ssl_hs_error;
        ssl_send_alert(pSVar34,2,iVar27);
        unaff_R14D = in_stack_fffffffffffffe0c;
      }
      break;
    case 1:
      if (hs->ssl->s3->ech_status == ssl_ech_accepted) {
        bVar21 = ssl_encrypt_client_hello
                           ((bssl *)hs,(SSL_HANDSHAKE *)0x0,
                            (Span<const_unsigned_char>)(ZEXT816(0x2380d0) << 0x40));
        sVar37 = ssl_hs_error;
        if (!bVar21) break;
      }
      bVar21 = ssl_add_client_hello(hs);
      sVar37 = ssl_hs_error;
      if (bVar21) {
        ssl_done_writing_client_hello(hs);
        hs->tls13_state = 2;
LAB_00167ca7:
        sVar37 = ssl_hs_flush;
      }
      break;
    case 2:
      pSVar34 = hs->ssl;
      bVar21 = (*pSVar34->method->get_message)(pSVar34,(SSLMessage *)local_c8);
      sVar37 = ssl_hs_read_message;
      if (bVar21) {
        local_148._16_2_ = 0;
        local_148._56_2_ = 0;
        local_148[0x3a] = '\0';
        in_stack_fffffffffffffe08 = CONCAT13(0x32,(int3)in_stack_fffffffffffffe08);
        bVar21 = parse_server_hello_tls13
                           (hs,(ParsedServerHello *)local_148,&stack0xfffffffffffffe0b,
                            (SSLMessage *)local_c8);
        if (bVar21) {
          if ((local_148._32_8_ == 0x20) &&
             (iVar27 = bcmp((void *)local_148._24_8_,kHelloRetryRequest,0x20), iVar27 == 0)) {
            ssl_send_alert(pSVar34,2,10);
            iVar27 = 0xdf;
            iVar35 = 0x183;
LAB_00168676:
            ERR_put_error(0x10,0,iVar27,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                          ,iVar35);
            sVar37 = ssl_hs_error;
            break;
          }
          uVar23 = SSL_CIPHER_get_protocol_id(hs->new_cipher);
          if (uVar23 != local_148._56_2_) {
            iVar27 = 0xf2;
            iVar35 = 0x189;
LAB_0016869c:
            ERR_put_error(0x10,0,iVar27,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                          ,iVar35);
            iVar27 = 0x2f;
            goto LAB_001686ae;
          }
          if (pSVar34->s3->ech_status == ssl_ech_accepted) {
            if ((pSVar34->s3->field_0xdd & 0x10) == 0) {
LAB_001679fa:
              __p._M_head_impl =
                   (hs->inner_transcript).buffer_._M_t.
                   super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl;
              (hs->inner_transcript).buffer_._M_t.
              super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl = (buf_mem_st *)0x0;
              std::__uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>::reset
                        ((__uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter> *)local_170,
                         __p._M_head_impl);
              EVP_MD_CTX_move(local_48,local_50);
              aVar3 = (anon_union_4_2_c8db58f8_for_extensions)hs->inner_extensions_sent;
              uVar23 = (hs->inner_transcript).version_;
              *(undefined2 *)&(hs->transcript).field_0x28 =
                   *(undefined2 *)&(hs->inner_transcript).field_0x28;
              (hs->transcript).version_ = uVar23;
              hs->extensions = aVar3;
              pSVar6 = pSVar34->s3;
              uVar14 = *(undefined8 *)local_58;
              uVar15 = *(undefined8 *)(local_58 + 8);
              uVar16 = *(undefined8 *)(local_58 + 0x18);
              *(undefined8 *)(pSVar6->client_random + 0x10) = *(undefined8 *)(local_58 + 0x10);
              *(undefined8 *)(pSVar6->client_random + 0x18) = uVar16;
              *(undefined8 *)pSVar6->client_random = uVar14;
              *(undefined8 *)(pSVar6->client_random + 8) = uVar15;
              goto LAB_00167a61;
            }
            bVar21 = check_ech_confirmation
                               (hs,(bool *)local_1d8,&stack0xfffffffffffffe0b,
                                (ParsedServerHello *)local_148);
            if (!bVar21) goto LAB_00168ada;
            if (local_1d8[0] != (bssl)0x0) goto LAB_001679fa;
            ERR_put_error(0x10,0,0x141,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                          ,0x197);
            uVar31 = 0x2f;
            goto LAB_00168ae7;
          }
LAB_00167a61:
          pSVar6 = pSVar34->s3;
          uVar14 = *(undefined8 *)local_148._24_8_;
          uVar15 = *(undefined8 *)(local_148._24_8_ + 8);
          uVar16 = *(undefined8 *)(local_148._24_8_ + 0x18);
          *(undefined8 *)(pSVar6->server_random + 0x10) = *(undefined8 *)(local_148._24_8_ + 0x10);
          *(undefined8 *)(pSVar6->server_random + 0x18) = uVar16;
          *(undefined8 *)pSVar6->server_random = uVar14;
          *(undefined8 *)(pSVar6->server_random + 8) = uVar15;
          pSVar5 = (pSVar34->session)._M_t.
                   super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
          if ((pSVar5 == (SSL_SESSION *)0x0) ||
             (SVar25 = ssl_session_get_type(pSVar5), SVar25 != kPreSharedKey)) {
            bVar21 = false;
          }
          else {
            bVar21 = pSVar34->s3->ech_status != ssl_ech_rejected;
          }
          psVar18 = _local_f8;
          uStack_f4 = SUB84(psVar18,4);
          _local_f8 = CONCAT13(0,CONCAT12(hs->key_shares[0]._M_t.
                                          super___uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>.
                                          _M_head_impl != (SSLKeyShare *)0x0,0x33));
          auStack_f0._0_8_ = (SSL_CONFIG *)0x0;
          auStack_f0._8_8_ = (uint8_t *)0x0;
          local_1a0[2] = (hs->pake_prover)._M_t.
                         super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>.
                         _M_t.
                         super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>
                         .super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl !=
                         (Prover *)0x0;
          local_1a0._0_2_ = 0x8a3b;
          local_1a0[3] = '\0';
          local_1a0._8_8_ = 0;
          lStack_190 = 0;
          _local_188 = CONCAT13(0,CONCAT12(bVar21,0x29));
          local_180.data = (uint8_t *)0x0;
          local_180.len = 0;
          local_168._0_4_ = 0x1002b;
          local_168._8_8_ = 0;
          lStack_158 = 0;
          local_1d8 = (undefined1  [8])local_f8;
          auStack_1d0._0_8_ = local_188;
          auStack_1d0._8_8_ = local_168;
          auStack_1d0._16_8_ = local_1a0;
          bVar21 = ssl_parse_extensions
                             ((bssl *)(local_148 + 0x40),(CBS *)&stack0xfffffffffffffe0b,local_1d8,
                              (initializer_list<bssl::SSLExtension_*>)ZEXT816(4),SUB81(in_R9,0));
          if (!bVar21) goto LAB_00168ada;
          if ((((local_168[3] != '\x01') ||
               (iVar27 = CBS_get_u16((CBS *)(local_168 + 8),(uint16_t *)&local_1e8), iVar27 == 0))
              || (lStack_158 != 0)) || ((uint16_t)local_1e8.data != pSVar34->s3->version)) {
            iVar27 = 0x120;
            iVar35 = 0x1bf;
            goto LAB_0016869c;
          }
          if ((local_1a0[3] == '\x01') && ((bStack_f5 != 0 || (cStack_185 == '\x01')))) {
            ERR_put_error(0x10,0,0xde,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                          ,0x1c9);
            iVar27 = 0x6e;
            goto LAB_001686ae;
          }
          pPVar12 = (hs->pake_prover)._M_t.
                    super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl;
          if (pPVar12 == (Prover *)0x0 || local_1a0[3] != '\0') {
            if ((pPVar12 != (Prover *)0x0) || (bStack_f5 != 0)) {
              if ((((bStack_f5 ^ 1) != 0 || local_1a0[3] != '\0') ||
                  ((cStack_185 == '\x01' && ((bStack_f5 ^ 1) != 0 || local_1a0[3] != '\0')))) &&
                 ((bStack_f5 != 0 || ((local_1a0[3] == '\0' || ((_local_188 & 0x1000000) != 0))))))
              {
                __assert_fail("(key_share.present && !pake_share.present && !pre_shared_key.present) || (key_share.present && !pake_share.present && pre_shared_key.present) || (!key_share.present && pake_share.present && !pre_shared_key.present)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                              ,0x1e3,
                              "enum ssl_hs_wait_t bssl::do_read_server_hello(SSL_HANDSHAKE *)");
              }
              in_stack_fffffffffffffe08 = CONCAT13(0x32,(int3)in_stack_fffffffffffffe08);
              if (cStack_185 == '\x01') {
                bVar21 = ssl_ext_pre_shared_key_parse_serverhello
                                   (hs,&stack0xfffffffffffffe0b,&local_180);
                if (!bVar21) goto LAB_00168ada;
                pSVar5 = (pSVar34->session)._M_t.
                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                if (pSVar5->ssl_version == pSVar34->s3->version) {
                  if (pSVar5->cipher->algorithm_prf == hs->new_cipher->algorithm_prf) {
                    bVar21 = ssl_session_is_context_valid(hs,pSVar5);
                    if (bVar21) {
                      puVar33 = &pSVar34->s3->field_0xdc;
                      *(ushort *)puVar33 = *(ushort *)puVar33 | 0x20;
                      hs->field_0x6ca = hs->field_0x6ca | 0x80;
                      SSL_SESSION_dup((bssl *)local_1d8,
                                      (pSVar34->session)._M_t.
                                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,0
                                     );
                      auVar17 = local_1d8;
                      local_1d8 = (undefined1  [8])0x0;
                      std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                                ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)
                                 local_90,(pointer)auVar17);
                      std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                                ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_1d8);
                      if ((hs->new_session)._M_t.
                          super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
                          (ssl_session_st *)0x0) {
                        ssl_set_session(pSVar34,(SSL_SESSION *)0x0);
                        ssl_session_renew_timeout
                                  (pSVar34,(local_90->_M_t).
                                           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                           _M_head_impl,
                                   ((pSVar34->session_ctx)._M_t.
                                    super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->
                                   session_psk_dhe_timeout);
                        in_stack_fffffffffffffe0c = unaff_R14D;
                        goto LAB_00168b04;
                      }
                      ssl_send_alert(pSVar34,2,0x50);
                    }
                    else {
                      ERR_put_error(0x10,0,0x65,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                                    ,0x1fc);
                      ssl_send_alert(pSVar34,2,0x2f);
                    }
LAB_0016813c:
                    sVar37 = ssl_hs_error;
                    in_stack_fffffffffffffe0c = unaff_R14D;
                    break;
                  }
                  iVar27 = 0x10c;
                  iVar35 = 500;
                }
                else {
                  iVar27 = 0xbc;
                  iVar35 = 0x1ee;
                }
                goto LAB_0016869c;
              }
              bVar21 = ssl_get_new_session(hs);
              if (!bVar21) {
                uVar31 = 0x50;
                goto LAB_00168ae7;
              }
LAB_00168b04:
              ((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
               ._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->cipher = hs->new_cipher
              ;
              uVar23 = ssl_protocol_version(pSVar34);
              md = (EVP_MD *)ssl_get_handshake_digest(uVar23,hs->new_cipher);
              iVar27 = EVP_MD_size(md);
              uVar29 = CONCAT44(extraout_var,iVar27);
              if ((pSVar34->s3->field_0xdc & 0x20) == 0) {
                puVar33 = kZeroes;
              }
              else {
                psVar8 = (hs->new_session)._M_t.
                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                uVar29 = (ulong)(psVar8->secret).size_;
                puVar33 = (psVar8->secret).storage_;
              }
              psk.size_ = uVar29;
              psk.data_ = puVar33;
              bVar21 = tls13_init_key_schedule(hs,psk);
              sVar37 = ssl_hs_error;
              if (!bVar21) break;
              local_1d8 = (undefined1  [8])0x0;
              auStack_1d0._0_8_ = (uchar *)0x0;
              in_stack_fffffffffffffe08 = CONCAT13(0x32,(int3)in_stack_fffffffffffffe08);
              if (bStack_f5 == '\x01') {
                contents = (CBS *)auStack_f0;
                bVar21 = ssl_ext_key_share_parse_serverhello
                                   (hs,(Array<unsigned_char> *)local_1d8,&stack0xfffffffffffffe0b,
                                    contents);
LAB_00168dd7:
                if (bVar21 == false) {
                  bVar32 = (byte)(in_stack_fffffffffffffe08 >> 0x18);
                  goto LAB_00168eee;
                }
                in_01.size_ = (size_t)contents;
                in_01.data_ = (uchar *)auStack_1d0._0_8_;
                bVar21 = tls13_advance_key_schedule((bssl *)hs,(SSL_HANDSHAKE *)local_1d8,in_01);
                sVar38 = ssl_hs_error;
                sVar37 = ssl_hs_error;
                if (((bVar21) && (bVar21 = ssl_hash_message(hs,(SSLMessage *)local_c8), bVar21)) &&
                   (bVar21 = tls13_derive_handshake_secrets(hs), sVar37 = sVar38, bVar21)) {
                  if (((hs->field_0x6c9 & 4) == 0) || (iVar27 = SSL_is_quic(pSVar34), iVar27 != 0))
                  {
                    in_R9 = (ulong)(hs->client_handshake_secret).size_;
                    traffic_secret_01.data_._4_4_ = unaff_R14D;
                    traffic_secret_01.data_._0_4_ = in_stack_fffffffffffffe08;
                    traffic_secret_01.size_ = (size_t)in_stack_fffffffffffffe10;
                    bVar21 = tls13_set_traffic_key
                                       ((bssl *)pSVar34,(SSL *)0x2,ssl_encryption_early_data,
                                        (evp_aead_direction_t)
                                        (hs->new_session)._M_t.
                                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl
                                        ,local_60,traffic_secret_01);
                    if (!bVar21) goto LAB_00168f01;
                  }
                  in_R9 = (ulong)(hs->server_handshake_secret).size_;
                  traffic_secret_02.data_._4_4_ = unaff_R14D;
                  traffic_secret_02.data_._0_4_ = in_stack_fffffffffffffe08;
                  traffic_secret_02.size_ = (size_t)in_stack_fffffffffffffe10;
                  bVar21 = tls13_set_traffic_key
                                     ((bssl *)pSVar34,(SSL *)0x2,ssl_encryption_initial,
                                      (evp_aead_direction_t)
                                      (hs->new_session)._M_t.
                                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                                      local_68,traffic_secret_02);
                  if (bVar21) {
                    (*pSVar34->method->next_message)(pSVar34);
                    hs->tls13_state = 3;
                    sVar37 = ssl_hs_ok;
                  }
                }
              }
              else {
                if (local_1a0[3] == '\x01') {
                  contents = (CBS *)(local_1a0 + 8);
                  bVar21 = ssl_ext_pake_parse_serverhello
                                     (hs,(Array<unsigned_char> *)local_1d8,&stack0xfffffffffffffe0b,
                                      contents);
                  goto LAB_00168dd7;
                }
                bVar32 = 0x50;
                ERR_put_error(0x10,0,0x44,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                              ,0x22f);
LAB_00168eee:
                sVar37 = ssl_hs_error;
                ssl_send_alert(pSVar34,2,(uint)bVar32);
              }
LAB_00168f01:
              Array<unsigned_char>::~Array((Array<unsigned_char> *)local_1d8);
              in_stack_fffffffffffffe0c = unaff_R14D;
              break;
            }
            iVar27 = 0x102;
            iVar35 = 0x1d6;
          }
          else {
            iVar27 = 0xa4;
            iVar35 = 0x1cf;
          }
          ERR_put_error(0x10,0,iVar27,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                        ,iVar35);
          iVar27 = 0x6d;
LAB_001686ae:
          ssl_send_alert(pSVar34,2,iVar27);
          sVar37 = ssl_hs_error;
        }
        else {
LAB_00168ada:
          uVar31 = in_stack_fffffffffffffe08 >> 0x18;
LAB_00168ae7:
          ssl_send_alert(pSVar34,2,uVar31);
LAB_00168aec:
          sVar37 = ssl_hs_error;
        }
      }
      break;
    case 3:
      pSVar34 = hs->ssl;
      bVar21 = (*pSVar34->method->get_message)(pSVar34,(SSLMessage *)local_148);
      sVar37 = ssl_hs_read_message;
      if (bVar21) {
        bVar21 = ssl_check_message_type(pSVar34,(SSLMessage *)local_148,8);
        sVar37 = ssl_hs_error;
        if (bVar21) {
          auStack_c0._0_8_ = CONCAT62(local_148._18_6_,local_148._16_2_);
          local_c8 = (undefined1  [8])local_148._8_8_;
          iVar27 = CBS_get_u16_length_prefixed((CBS *)local_c8,(CBS *)local_1d8);
          if ((iVar27 == 0) || ((uint8_t *)auStack_c0._0_8_ != (uint8_t *)0x0)) {
            ERR_put_error(0x10,0,0x89,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                          ,0x25e);
            iVar27 = 0x32;
            goto LAB_001686ae;
          }
          bVar21 = ssl_parse_serverhello_tlsext(hs,(CBS *)local_1d8);
          if (!bVar21) {
            iVar27 = 0xbe;
            iVar35 = 0x264;
            goto LAB_00168676;
          }
          pSVar6 = pSVar34->s3;
          if ((*(uint *)&pSVar6->field_0xdc >> 9 & 1) == 0) {
LAB_00167b48:
            pAVar36 = &((hs->new_session)._M_t.
                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->early_alpn;
            puVar28 = (pSVar34->s3->alpn_selected).data_;
            sVar7 = (pSVar34->s3->alpn_selected).size_;
            bVar21 = Array<unsigned_char>::InitUninitialized(pAVar36,sVar7);
            if (sVar7 != 0 && bVar21) {
              memmove(pAVar36->data_,puVar28,sVar7);
            }
            if (bVar21) {
              bVar21 = ssl_hash_message(hs,(SSLMessage *)local_148);
              sVar37 = ssl_hs_error;
              in_stack_fffffffffffffe0c = unaff_R14D;
              if (bVar21) {
                (*pSVar34->method->next_message)(pSVar34);
                hs->tls13_state = 4;
                sVar37 = ssl_hs_ok;
                if (((hs->field_0x6c9 & 4) != 0) && ((pSVar34->s3->field_0xdd & 2) == 0)) {
                  bVar21 = close_early_data(hs,ssl_encryption_handshake);
                  sVar37 = ssl_hs_error;
                  if (bVar21) {
                    sVar37 = ssl_hs_early_data_rejected;
                  }
                }
              }
              break;
            }
            ssl_send_alert(pSVar34,2,0x50);
            in_stack_fffffffffffffe0c = unaff_R14D;
          }
          else {
            if ((*(uint *)&pSVar6->field_0xdc & 0x20) == 0) {
              __assert_fail("ssl->s3->session_reused",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                            ,0x26a,
                            "enum ssl_hs_wait_t bssl::do_read_encrypted_extensions(SSL_HANDSHAKE *)"
                           );
            }
            if (pSVar6->ech_status == ssl_ech_rejected) {
              __assert_fail("ssl->s3->ech_status != ssl_ech_rejected",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                            ,0x26e,
                            "enum ssl_hs_wait_t bssl::do_read_encrypted_extensions(SSL_HANDSHAKE *)"
                           );
            }
            psVar8 = (hs->new_session)._M_t.
                     super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
            psVar11 = (hs->early_session)._M_t.
                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
            if (psVar11->cipher == psVar8->cipher) {
              __n = (psVar11->early_alpn).size_;
              if ((__n == (pSVar6->alpn_selected).size_) &&
                 ((__n == 0 ||
                  (iVar27 = bcmp((psVar11->early_alpn).data_,(pSVar6->alpn_selected).data_,__n),
                  iVar27 == 0)))) {
                if (((hs->field_0x6cb & 1) == 0) && ((psVar8->field_0x1b8 & 0x40) == 0)) {
                  psVar8->field_0x1b8 = psVar11->field_0x1b8 & 0x40 | psVar8->field_0x1b8;
                  pAVar36 = &((hs->new_session)._M_t.
                              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                             local_application_settings;
                  psVar8 = (hs->early_session)._M_t.
                           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                  puVar28 = (psVar8->local_application_settings).data_;
                  sVar7 = (psVar8->local_application_settings).size_;
                  bVar21 = Array<unsigned_char>::InitUninitialized(pAVar36,sVar7);
                  if (sVar7 != 0 && bVar21) {
                    memmove(pAVar36->data_,puVar28,sVar7);
                  }
                  if (bVar21) {
                    pAVar36 = &((hs->new_session)._M_t.
                                super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                               peer_application_settings;
                    psVar8 = (hs->early_session)._M_t.
                             super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                    puVar28 = (psVar8->peer_application_settings).data_;
                    sVar7 = (psVar8->peer_application_settings).size_;
                    bVar21 = Array<unsigned_char>::InitUninitialized(pAVar36,sVar7);
                    if (sVar7 != 0 && bVar21) {
                      memmove(pAVar36->data_,puVar28,sVar7);
                    }
                    if (bVar21) goto LAB_00167b48;
                  }
                  ssl_send_alert(pSVar34,2,0x50);
                  in_stack_fffffffffffffe0c = unaff_R14D;
                  goto LAB_0016896b;
                }
                iVar27 = 0x117;
                iVar35 = 0x27e;
              }
              else {
                iVar27 = 0x115;
                iVar35 = 0x276;
              }
            }
            else {
              iVar27 = 0x130;
              iVar35 = 0x271;
            }
            ERR_put_error(0x10,0,iVar27,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                          ,iVar35);
            ssl_send_alert(pSVar34,2,0x2f);
            in_stack_fffffffffffffe0c = unaff_R14D;
          }
LAB_0016896b:
          sVar37 = ssl_hs_error;
          unaff_R14D = in_stack_fffffffffffffe0c;
        }
      }
      break;
    case 4:
      pSVar34 = hs->ssl;
      uVar2 = *(ushort *)&pSVar34->s3->field_0xdc;
      if ((uVar2 & 0x20) == 0) {
        if ((hs->pake_prover)._M_t.
            super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl == (Prover *)0x0)
        {
          bVar21 = (*pSVar34->method->get_message)(pSVar34,(SSLMessage *)local_148);
          sVar37 = ssl_hs_read_message;
          if (!bVar21) break;
          if (local_148[1] == '\r') {
            local_c8._0_4_ = 0x1000d;
            auStack_c0._0_8_ = (uint8_t *)0x0;
            auStack_c0._8_8_ = (uint8_t *)0x0;
            local_1d8._0_4_ = 0x1002f;
            auStack_1d0._0_8_ = (uchar *)0x0;
            auStack_1d0._8_8_ = (uint8_t *)0x0;
            auStack_f0._0_8_ = CONCAT62(local_148._18_6_,local_148._16_2_);
            _local_f8 = (ssl_credential_st *)local_148._8_8_;
            in_stack_fffffffffffffe08 = CONCAT13(0x32,(int3)in_stack_fffffffffffffe08);
            iVar27 = CBS_get_u8_length_prefixed((CBS *)local_f8,(CBS *)local_1a0);
            if ((((iVar27 != 0) && (local_1a0._8_8_ == 0)) &&
                (iVar27 = CBS_get_u16_length_prefixed((CBS *)local_f8,(CBS *)local_188), iVar27 != 0
                )) && ((SSL_CONFIG *)auStack_f0._0_8_ == (SSL_CONFIG *)0x0)) {
              local_1e8.len = (size_t)local_1d8;
              extensions._M_len = 1;
              extensions._M_array = (iterator)0x2;
              local_1e8.data = (uint8_t *)local_c8;
              bVar21 = ssl_parse_extensions
                                 ((bssl *)local_188,(CBS *)&stack0xfffffffffffffe0b,
                                  (uint8_t *)&local_1e8,extensions,SUB81(in_R9,0));
              if (((bVar21) && (local_c8[3] == '\x01')) &&
                 ((iVar27 = CBS_get_u16_length_prefixed((CBS *)auStack_c0,(CBS *)local_168),
                  iVar27 != 0 && (bVar21 = tls1_parse_peer_sigalgs(hs,(CBS *)local_168), bVar21))))
              {
                if (local_1d8[3] == '\x01') {
                  SSL_parse_CA_list((bssl *)&local_1e8,pSVar34,&stack0xfffffffffffffe0b,
                                    (CBS *)auStack_1d0);
                  pUVar19 = local_80;
                  puVar1 = local_1e8.data;
                  local_1e8.data = (uint8_t *)0x0;
                  std::__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset
                            ((__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)
                             local_80,(pointer)puVar1);
                  std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)
                             &local_1e8);
                  if ((pUVar19->_M_t).
                      super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl !=
                      (stack_st_CRYPTO_BUFFER *)0x0) {
LAB_00168b77:
                    hs->field_0x6c8 = hs->field_0x6c8 | 0x20;
                    (*((pSVar34->ctx)._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->x509_method->
                      hs_flush_cached_ca_names)(hs);
                    bVar21 = ssl_hash_message(hs,(SSLMessage *)local_148);
                    sVar37 = ssl_hs_error;
                    in_stack_fffffffffffffe0c = unaff_R14D;
                    if (!bVar21) break;
                    (*pSVar34->method->next_message)(pSVar34);
                    goto LAB_00168bb3;
                  }
                  uVar31 = in_stack_fffffffffffffe08 >> 0x18;
                }
                else {
                  __p_00 = OPENSSL_sk_new_null();
                  pUVar19 = local_80;
                  std::__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset
                            ((__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)
                             local_80,(pointer)__p_00);
                  if ((pUVar19->_M_t).
                      super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl !=
                      (stack_st_CRYPTO_BUFFER *)0x0) goto LAB_00168b77;
                  uVar31 = 0x50;
                }
                ssl_send_alert(pSVar34,2,uVar31);
                sVar37 = ssl_hs_error;
                in_stack_fffffffffffffe0c = unaff_R14D;
                break;
              }
            }
            ssl_send_alert(pSVar34,2,in_stack_fffffffffffffe08 >> 0x18);
            iVar27 = 0x89;
            iVar35 = 0x2ce;
            goto LAB_00168676;
          }
LAB_00168bb3:
          hs->tls13_state = 5;
        }
        else {
LAB_00168046:
          hs->tls13_state = 8;
        }
      }
      else {
        if (((uVar2 >> 9 & 1) != 0) ||
           (((pSVar34->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->reverify_on_resume == false))
        goto LAB_00168046;
        hs->tls13_state = 7;
      }
      goto LAB_0016804d;
    case 5:
      pSVar34 = hs->ssl;
      bVar21 = (*pSVar34->method->get_message)(pSVar34,(SSLMessage *)local_148);
      sVar37 = ssl_hs_read_message;
      if (bVar21) {
        if (local_148[1] != '\x19') {
          bVar21 = ssl_check_message_type(pSVar34,(SSLMessage *)local_148,0xb);
          sVar37 = ssl_hs_error;
          if (!bVar21) break;
        }
        bVar21 = tls13_process_certificate(hs,(SSLMessage *)local_148,false);
        sVar37 = ssl_hs_error;
        if ((bVar21) && (bVar21 = ssl_hash_message(hs,(SSLMessage *)local_148), bVar21)) {
          (*pSVar34->method->next_message)(pSVar34);
          hs->tls13_state = 6;
          goto LAB_0016804d;
        }
      }
      break;
    case 6:
      pSVar34 = hs->ssl;
      bVar21 = (*pSVar34->method->get_message)(pSVar34,(SSLMessage *)local_148);
      sVar37 = ssl_hs_read_message;
      if (bVar21) {
        sVar26 = ssl_verify_peer_cert(hs);
        sVar37 = ssl_hs_error;
        if (sVar26 != ssl_verify_invalid) {
          if (sVar26 == ssl_verify_retry) {
            sVar37 = ssl_hs_certificate_verify;
            iVar27 = 6;
          }
          else {
            bVar21 = ssl_check_message_type(pSVar34,(SSLMessage *)local_148,0xf);
            if (((!bVar21) ||
                (bVar21 = tls13_process_certificate_verify(hs,(SSLMessage *)local_148), !bVar21)) ||
               (bVar21 = ssl_hash_message(hs,(SSLMessage *)local_148), !bVar21)) break;
            (*pSVar34->method->next_message)(pSVar34);
            sVar37 = ssl_hs_ok;
            iVar27 = 8;
          }
          hs->tls13_state = iVar27;
        }
      }
      break;
    case 7:
      sVar26 = ssl_reverify_peer_cert(hs,true);
      sVar37 = ssl_hs_error;
      if (sVar26 != ssl_verify_invalid) {
        if (sVar26 != ssl_verify_retry) goto LAB_00168046;
        hs->tls13_state = 7;
        sVar37 = ssl_hs_certificate_verify;
      }
      break;
    case 8:
      pSVar34 = hs->ssl;
      bVar21 = (*pSVar34->method->get_message)(pSVar34,(SSLMessage *)local_148);
      sVar37 = ssl_hs_read_message;
      if (bVar21) {
        bVar21 = ssl_check_message_type(pSVar34,(SSLMessage *)local_148,0x14);
        sVar37 = ssl_hs_error;
        if (bVar21) {
          sVar37 = ssl_hs_error;
          bVar21 = tls13_process_finished(hs,(SSLMessage *)local_148,false);
          if ((bVar21) && (bVar21 = ssl_hash_message(hs,(SSLMessage *)local_148), bVar21)) {
            puVar28 = (uchar *)SSLTranscript::DigestLen(local_170);
            in_00.size_ = (size_t)puVar30;
            in_00.data_ = puVar28;
            bVar21 = tls13_advance_key_schedule((bssl *)hs,(SSL_HANDSHAKE *)kZeroes,in_00);
            if ((bVar21) && (bVar21 = tls13_derive_application_secrets(hs), bVar21)) {
              bVar21 = (*pSVar34->method->has_unprocessed_handshake_data)(pSVar34);
              if (bVar21) {
                ssl_send_alert(pSVar34,2,10);
                iVar27 = 0xff;
                iVar35 = 0x33e;
                goto LAB_00168676;
              }
              (*pSVar34->method->next_message)(pSVar34);
              hs->tls13_state = 9;
              goto LAB_0016804d;
            }
          }
        }
      }
      break;
    case 9:
      pSVar34 = hs->ssl;
      if ((pSVar34->s3->field_0xdd & 2) != 0) {
        iVar27 = SSL_is_quic(pSVar34);
        if ((iVar27 == 0) && (iVar27 = SSL_is_dtls(pSVar34), iVar27 == 0)) {
          CBB_zero((CBB *)local_148);
          bVar21 = (*pSVar34->method->init_message)(pSVar34,(CBB *)local_148,(CBB *)local_c8,'\x05')
          ;
          if ((!bVar21) || (bVar21 = ssl_add_message_cbb(pSVar34,(CBB *)local_148), !bVar21)) {
            CBB_cleanup((CBB *)local_148);
            goto LAB_00168aec;
          }
          CBB_cleanup((CBB *)local_148);
        }
        bVar21 = close_early_data(hs,ssl_encryption_handshake);
        sVar37 = ssl_hs_error;
        if (!bVar21) break;
      }
      hs->tls13_state = 10;
      goto LAB_0016804d;
    case 10:
      if (((((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->field_0x1b8 & 0x40) != 0)
         && (pSVar34 = hs->ssl, (pSVar34->s3->field_0xdd & 2) == 0)) {
        CBB_zero((CBB *)local_148);
        uVar23 = 0x44cd;
        if ((*(ushort *)&hs->config->field_0x10d >> 0xd & 1) == 0) {
          uVar23 = 0x4469;
        }
        bVar21 = (*pSVar34->method->init_message)(pSVar34,(CBB *)local_148,(CBB *)local_c8,'\b');
        if (((((!bVar21) ||
              (iVar27 = CBB_add_u16_length_prefixed((CBB *)local_c8,(CBB *)local_1d8), iVar27 == 0))
             || (iVar27 = CBB_add_u16((CBB *)local_1d8,uVar23), iVar27 == 0)) ||
            ((iVar27 = CBB_add_u16_length_prefixed((CBB *)local_1d8,(CBB *)local_f8), iVar27 == 0 ||
             (psVar8 = (hs->new_session)._M_t.
                       super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
             iVar27 = CBB_add_bytes((CBB *)local_f8,(psVar8->local_application_settings).data_,
                                    (psVar8->local_application_settings).size_), iVar27 == 0)))) ||
           (bVar21 = ssl_add_message_cbb(pSVar34,(CBB *)local_148), !bVar21)) {
          CBB_cleanup((CBB *)local_148);
          goto LAB_0016813c;
        }
        CBB_cleanup((CBB *)local_148);
        in_stack_fffffffffffffe0c = unaff_R14D;
      }
      hs->tls13_state = 0xb;
LAB_0016804d:
      sVar37 = ssl_hs_ok;
      break;
    case 0xb:
      if ((hs->field_0x6c8 & 0x20) == 0) {
LAB_001678e4:
        hs->tls13_state = 0xd;
        goto LAB_0016804d;
      }
      ssl = (SSL_HANDSHAKE *)hs->ssl;
      if (*(int *)(*(long *)((__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true> *)
                             (ssl->secret).storage_ + 2) + 0xd8) == 2) {
        SSL_certs_clear((SSL *)ssl);
      }
      else {
        pCVar9 = (hs->config->cert)._M_t.super___uniq_ptr_impl<bssl::CERT,_bssl::internal::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_bssl::CERT_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bssl::CERT_*,_false>._M_head_impl;
        p_Var10 = pCVar9->cert_cb;
        if (p_Var10 != (_func_int_SSL_ptr_void_ptr *)0x0) {
          iVar27 = (*p_Var10)((SSL *)ssl,pCVar9->cert_cb_arg);
          if (iVar27 == 0) {
            ssl_send_alert((SSL *)ssl,2,0x50);
            bVar21 = false;
            ERR_put_error(0x10,0,0x7e,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                          ,0x3a0);
            pSVar39 = (SSL_HANDSHAKE *)0x0;
          }
          else {
            bVar21 = true;
            pSVar39 = ssl;
            if (iVar27 < 0) {
              hs->tls13_state = 0xb;
              pSVar39 = (SSL_HANDSHAKE *)0x8;
              bVar21 = false;
            }
          }
          sVar37 = (ssl_hs_wait_t)pSVar39;
          in_stack_fffffffffffffe0c = unaff_R14D;
          if (!bVar21) break;
        }
      }
      local_148._0_8_ = (uint8_t *)0x0;
      local_148._8_8_ = (ssl_credential_st *)0x0;
      bVar21 = ssl_get_full_credential_list(hs,(Array<ssl_credential_st_*> *)local_148);
      sVar37 = ssl_hs_error;
      if (bVar21) {
        in_stack_fffffffffffffe10 = ssl;
        if ((ssl_credential_st *)local_148._8_8_ != (ssl_credential_st *)0x0) {
          puVar1 = (uint8_t *)(local_148._0_8_ + local_148._8_8_ * 8);
          puVar40 = (uint8_t *)local_148._0_8_;
          do {
            while( true ) {
              cred = *(SSL_CREDENTIAL **)puVar40;
              ERR_clear_error();
              if (cred->type == kX509) {
                bVar21 = tls1_choose_signature_algorithm(hs,cred,(uint16_t *)local_1d8);
                if (bVar21) {
                  bVar21 = ssl_credential_matches_requested_issuers(hs,cred);
                }
                else {
                  bVar21 = false;
                }
              }
              else {
                bVar21 = false;
                ERR_put_error(0x10,0,0xe4,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                              ,0x381);
              }
              if (bVar21 == false) break;
              if (cred != (SSL_CREDENTIAL *)0x0) {
                SSL_CREDENTIAL_up_ref(cred);
              }
              local_c8 = (undefined1  [8])0x0;
              std::__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>::reset
                        ((__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter> *)local_78,
                         cred);
              std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *)local_c8);
              hs->signature_algorithm = local_1d8._0_2_;
              puVar40 = puVar40 + 8;
              in_stack_fffffffffffffe10 = ssl;
              if (bVar21 != false || puVar40 == puVar1) goto LAB_00168416;
            }
            puVar40 = puVar40 + 8;
            in_stack_fffffffffffffe10 = ssl;
          } while (puVar40 != puVar1);
LAB_00168416:
          in_stack_fffffffffffffe0c = unaff_R14D;
          if ((local_78->_M_t).super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>.
              _M_t.super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl ==
              (ssl_credential_st *)0x0) {
            uVar29 = ERR_peek_error();
            if ((int)uVar29 == 0) {
              __assert_fail("ERR_peek_error() != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                            ,0x3bb,
                            "enum ssl_hs_wait_t bssl::do_send_client_certificate(SSL_HANDSHAKE *)");
            }
            ssl_send_alert((SSL *)in_stack_fffffffffffffe10,2,0x28);
            sVar37 = ssl_hs_error;
            goto LAB_00168606;
          }
        }
        bVar21 = tls13_add_certificate(hs);
        if (bVar21) {
          hs->tls13_state = 0xc;
          sVar37 = ssl_hs_ok;
        }
      }
LAB_00168606:
      OPENSSL_free((void *)local_148._0_8_);
      break;
    case 0xc:
      if ((hs->credential)._M_t.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>.
          _M_t.super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl == (ssl_credential_st *)0x0
         ) goto LAB_001678e4;
      sVar24 = tls13_add_certificate_verify(hs);
      sVar37 = ssl_hs_error;
      if (sVar24 != ssl_private_key_failure) {
        if (sVar24 != ssl_private_key_retry) {
          if (sVar24 != ssl_private_key_success) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                          ,0x3dd,
                          "enum ssl_hs_wait_t bssl::do_send_client_certificate_verify(SSL_HANDSHAKE *)"
                         );
          }
          goto LAB_001678e4;
        }
        hs->tls13_state = 0xc;
        sVar37 = ssl_hs_private_key_operation;
      }
      break;
    case 0xd:
      pSVar34 = hs->ssl;
      uVar31 = *(uint *)&hs->field_0x6c8;
      *(uint *)&hs->field_0x6c8 = uVar31 | 0x800000;
      if ((uVar31 >> 0x18 & 1) != 0) {
        CBB_zero((CBB *)local_148);
        bVar21 = (*pSVar34->method->init_message)(pSVar34,(CBB *)local_148,(CBB *)local_c8,0xcb);
        if (((!bVar21) || (bVar21 = tls1_write_channel_id(hs,(CBB *)local_c8), !bVar21)) ||
           (bVar21 = ssl_add_message_cbb(pSVar34,(CBB *)local_148), !bVar21)) {
          CBB_cleanup((CBB *)local_148);
          goto LAB_00168aec;
        }
        CBB_cleanup((CBB *)local_148);
      }
      bVar21 = tls13_add_finished(hs);
      sVar37 = ssl_hs_error;
      if (bVar21) {
        in_R9 = (ulong)(hs->client_traffic_secret_0).size_;
        traffic_secret.data_._4_4_ = in_stack_fffffffffffffe0c;
        traffic_secret.data_._0_4_ = in_stack_fffffffffffffe08;
        traffic_secret.size_ = (size_t)in_stack_fffffffffffffe10;
        bVar21 = tls13_set_traffic_key
                           ((bssl *)pSVar34,(SSL *)0x3,ssl_encryption_early_data,
                            (evp_aead_direction_t)
                            (hs->new_session)._M_t.
                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,local_38,
                            traffic_secret);
        sVar37 = ssl_hs_error;
        if (bVar21) {
          in_R9 = (ulong)(hs->server_traffic_secret_0).size_;
          traffic_secret_00.data_._4_4_ = in_stack_fffffffffffffe0c;
          traffic_secret_00.data_._0_4_ = in_stack_fffffffffffffe08;
          traffic_secret_00.size_ = (size_t)in_stack_fffffffffffffe10;
          bVar21 = tls13_set_traffic_key
                             ((bssl *)pSVar34,(SSL *)0x3,ssl_encryption_initial,
                              (evp_aead_direction_t)
                              (hs->new_session)._M_t.
                              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,local_40,
                              traffic_secret_00);
          sVar37 = ssl_hs_error;
          if ((bVar21) && (bVar21 = tls13_derive_resumption_secret(hs), bVar21)) {
            hs->tls13_state = 0xe;
            goto LAB_00167ca7;
          }
        }
      }
      break;
    case 0xe:
      return ssl_hs_ok;
    }
    if (*(int *)&(((UniquePtr<BIO> *)&hs->tls13_state)->_M_t).
                 super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bio_st_*,_false>._M_head_impl != (int)local_70) {
      ssl_do_info_callback(hs->ssl,0x1001,1);
    }
    if (sVar37 != ssl_hs_ok) {
      return sVar37;
    }
  } while( true );
}

Assistant:

enum ssl_hs_wait_t tls13_client_handshake(SSL_HANDSHAKE *hs) {
  while (hs->tls13_state != state_done) {
    enum ssl_hs_wait_t ret = ssl_hs_error;
    enum client_hs_state_t state =
        static_cast<enum client_hs_state_t>(hs->tls13_state);
    switch (state) {
      case state_read_hello_retry_request:
        ret = do_read_hello_retry_request(hs);
        break;
      case state_send_second_client_hello:
        ret = do_send_second_client_hello(hs);
        break;
      case state_read_server_hello:
        ret = do_read_server_hello(hs);
        break;
      case state_read_encrypted_extensions:
        ret = do_read_encrypted_extensions(hs);
        break;
      case state_read_certificate_request:
        ret = do_read_certificate_request(hs);
        break;
      case state_read_server_certificate:
        ret = do_read_server_certificate(hs);
        break;
      case state_read_server_certificate_verify:
        ret = do_read_server_certificate_verify(hs);
        break;
      case state_server_certificate_reverify:
        ret = do_server_certificate_reverify(hs);
        break;
      case state_read_server_finished:
        ret = do_read_server_finished(hs);
        break;
      case state_send_end_of_early_data:
        ret = do_send_end_of_early_data(hs);
        break;
      case state_send_client_certificate:
        ret = do_send_client_certificate(hs);
        break;
      case state_send_client_encrypted_extensions:
        ret = do_send_client_encrypted_extensions(hs);
        break;
      case state_send_client_certificate_verify:
        ret = do_send_client_certificate_verify(hs);
        break;
      case state_complete_second_flight:
        ret = do_complete_second_flight(hs);
        break;
      case state_done:
        ret = ssl_hs_ok;
        break;
    }

    if (hs->tls13_state != state) {
      ssl_do_info_callback(hs->ssl, SSL_CB_CONNECT_LOOP, 1);
    }

    if (ret != ssl_hs_ok) {
      return ret;
    }
  }

  return ssl_hs_ok;
}